

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

char * xmlTextReaderBuildMessage(char *msg,__va_list_tag *ap)

{
  uint uVar1;
  char *__s;
  char *pcVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  void *pvVar5;
  size_t __maxlen;
  xmlGenericErrorFunc p_Var6;
  va_list aq;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  __maxlen = 0;
  pcVar2 = (char *)0x0;
  do {
    __s = pcVar2;
    local_38 = ap->reg_save_area;
    local_48._0_4_ = ap->gp_offset;
    local_48._4_4_ = ap->fp_offset;
    pvStack_40 = ap->overflow_arg_area;
    uVar1 = vsnprintf(__s,__maxlen,msg,&local_48);
    if ((int)uVar1 < 0) {
      pp_Var3 = __xmlGenericError();
      p_Var6 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      pvVar5 = *ppvVar4;
      pcVar2 = "vsnprintf failed !\n";
      goto LAB_0019f977;
    }
    if ((int)__maxlen == 64000) {
      return __s;
    }
    if ((int)uVar1 < (int)__maxlen) {
      return __s;
    }
    __maxlen = (size_t)(uVar1 + 1);
    if (63999 < uVar1) {
      __maxlen = 64000;
    }
    pcVar2 = (char *)(*xmlRealloc)(__s,__maxlen);
  } while (pcVar2 != (char *)0x0);
  pp_Var3 = __xmlGenericError();
  p_Var6 = *pp_Var3;
  ppvVar4 = __xmlGenericErrorContext();
  pvVar5 = *ppvVar4;
  pcVar2 = "xmlRealloc failed !\n";
LAB_0019f977:
  (*p_Var6)(pvVar5,pcVar2);
  if (__s != (char *)0x0) {
    (*xmlFree)(__s);
  }
  return (char *)0x0;
}

Assistant:

static char *
xmlTextReaderBuildMessage(const char *msg, va_list ap) {
    int size = 0;
    int chars;
    char *larger;
    char *str = NULL;
    va_list aq;

    while (1) {
        VA_COPY(aq, ap);
        chars = vsnprintf(str, size, msg, aq);
        va_end(aq);
        if (chars < 0) {
	    xmlGenericError(xmlGenericErrorContext, "vsnprintf failed !\n");
	    if (str)
		xmlFree(str);
	    return NULL;
	}
	if ((chars < size) || (size == MAX_ERR_MSG_SIZE))
            break;
        if (chars < MAX_ERR_MSG_SIZE)
	size = chars + 1;
	else
		size = MAX_ERR_MSG_SIZE;
        if ((larger = (char *) xmlRealloc(str, size)) == NULL) {
	    xmlGenericError(xmlGenericErrorContext, "xmlRealloc failed !\n");
	    if (str)
                xmlFree(str);
            return NULL;
        }
        str = larger;
    }

    return str;
}